

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::internal::format_decimal<unsigned_long,char,fmt::internal::NoThousandsSep>
               (long param_1,ulong param_2,uint param_3)

{
  long lVar1;
  uint index;
  uint index_1;
  ulong local_18;
  char *local_10;
  NoThousandsSep local_1;
  
  local_18 = param_2;
  local_10 = (char *)(param_1 + (ulong)param_3);
  while (99 < local_18) {
    lVar1 = (local_18 % 100) * 2;
    local_18 = local_18 / 100;
    local_10[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [(int)lVar1 + 1];
    NoThousandsSep::operator()(&local_1,local_10 + -1);
    local_10[-2] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [lVar1];
    NoThousandsSep::operator()(&local_1,local_10 + -2);
    local_10 = local_10 + -2;
  }
  if (local_18 < 10) {
    local_10[-1] = (char)local_18 + '0';
  }
  else {
    local_10[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [(int)(local_18 << 1) + 1];
    NoThousandsSep::operator()(&local_1,local_10 + -1);
    local_10[-2] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [local_18 << 1 & 0xffffffff];
  }
  return;
}

Assistant:

inline void format_decimal(Char *buffer, UInt value, unsigned num_digits,
                           ThousandsSep thousands_sep) {
  buffer += num_digits;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = Data::DIGITS[index + 1];
    thousands_sep(buffer);
    *--buffer = Data::DIGITS[index];
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<char>('0' + value);
    return;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = Data::DIGITS[index + 1];
  thousands_sep(buffer);
  *--buffer = Data::DIGITS[index];
}